

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O1

Vec_Int_t * Gia_VtaConvertFromGla(Gia_Man_t *p,Vec_Int_t *vGla,int nFrames)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int Entry;
  int iVar7;
  bool bVar8;
  uint local_40;
  
  uVar1 = p->nObjs;
  if ((long)vGla->nSize < 1) {
    iVar6 = 0;
  }
  else {
    lVar5 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + vGla->pArray[lVar5];
      lVar5 = lVar5 + 1;
    } while (vGla->nSize != lVar5);
  }
  local_40 = uVar1;
  if (1 < uVar1) {
    uVar3 = uVar1 - 1;
    if (uVar3 == 0) {
      local_40 = 0;
    }
    else {
      iVar7 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      local_40 = iVar7 + 0x21;
    }
  }
  uVar3 = uVar1;
  if (1 < uVar1) {
    uVar3 = uVar1 - 1;
    if (uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      iVar7 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      uVar3 = iVar7 + 0x21;
    }
  }
  if (~(-1 << ((byte)uVar3 & 0x1f)) < (int)uVar1) {
    __assert_fail("nObjs <= nObjMask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absUtil.c"
                  ,0x79,"Vec_Int_t *Gia_VtaConvertFromGla(Gia_Man_t *, Vec_Int_t *, int)");
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_00->pArray = piVar2;
  Vec_IntPush(p_00,nFrames);
  if (-1 < nFrames) {
    Entry = nFrames + 2;
    iVar4 = nFrames + 1;
    iVar7 = iVar6;
    do {
      Vec_IntPush(p_00,Entry);
      Entry = Entry + iVar7;
      iVar7 = iVar7 + iVar6;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  if (0 < nFrames) {
    iVar6 = 1;
    do {
      iVar7 = 0;
      do {
        if (0 < vGla->nSize) {
          lVar5 = 0;
          do {
            if (vGla->pArray[lVar5] != 0) {
              Vec_IntPush(p_00,iVar7 << ((byte)local_40 & 0x1f) | (uint)lVar5);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < vGla->nSize);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != iVar6);
      bVar8 = iVar6 != nFrames;
      iVar6 = iVar6 + 1;
    } while (bVar8);
  }
  if (-2 < nFrames) {
    if ((int)(nFrames + 1U) < p_00->nSize) {
      if (p_00->pArray[nFrames + 1U] != p_00->nSize) {
        __assert_fail("Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absUtil.c"
                      ,0x86,"Vec_Int_t *Gia_VtaConvertFromGla(Gia_Man_t *, Vec_Int_t *, int)");
      }
      return p_00;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Gia_VtaConvertFromGla( Gia_Man_t * p, Vec_Int_t * vGla, int nFrames )
{
    Vec_Int_t * vVta;
    int nObjBits, nObjMask, nObjs = Gia_ManObjNum(p);
    int i, k, j, Entry, Counter, nGlaSize;
    //. get the GLA size
    nGlaSize = Vec_IntSum(vGla);
    // get the bitmask
    nObjBits = Abc_Base2Log(nObjs);
    nObjMask = (1 << Abc_Base2Log(nObjs)) - 1;
    assert( nObjs <= nObjMask );
    // go through objects
    vVta = Vec_IntAlloc( 1000 );
    Vec_IntPush( vVta, nFrames );
    Counter = nFrames + 2;
    for ( i = 0; i <= nFrames; i++, Counter += i * nGlaSize )
        Vec_IntPush( vVta, Counter );
    for ( i = 0; i < nFrames; i++ )
        for ( k = 0; k <= i; k++ )
            Vec_IntForEachEntry( vGla, Entry, j )
                if ( Entry ) 
                    Vec_IntPush( vVta, (k << nObjBits) | j );
    Counter = Vec_IntEntry(vVta, nFrames+1);
    assert( Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta) );
    return vVta;
}